

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::read_dds_internal
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  dynamic_string *this_00;
  face_vec *this_01;
  uchar auVar1 [4];
  bool bVar2;
  int iVar3;
  uint uVar4;
  component_flags cVar5;
  crn_uint32 cVar6;
  uint uVar7;
  ulong uVar8;
  mip_level *this_02;
  byte *pbVar9;
  undefined4 extraout_var;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  ulong uVar13;
  uchar uVar15;
  uint uVar16;
  anon_union_4_2_f794ea7c_for_DDSURFACEDESC2_4 aVar17;
  char *pcVar18;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  color_quad<unsigned_char,_int> *pcVar19;
  pixel_format pVar20;
  ulong uVar21;
  uint uVar22;
  uint i;
  long lVar23;
  uint uVar24;
  uint new_size;
  anon_union_4_2_f794ea7c_for_DDSURFACEDESC2_4 aVar25;
  ulong uVar26;
  bool bVar27;
  uint local_178;
  uchar local_174 [4];
  uint width;
  uint height;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_168;
  dxt_image *local_160;
  uint local_154;
  anon_union_4_2_f794ea7c_for_DDSURFACEDESC2_4 local_150;
  anon_union_4_2_f794ea7c_for_DDSURFACEDESC2_4 local_14c;
  vector<unsigned_char> load_buf;
  uint8 hdr [4];
  uint mask_size [4];
  uint mask_ofs [4];
  DDSURFACEDESC2 desc;
  ulong uVar14;
  
  clear(this);
  this_00 = &this->m_last_error;
  dynamic_string::operator=(this_00,"Not a DDS file");
  iVar3 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,hdr,4);
  if (iVar3 != 4) {
    return false;
  }
  if (hdr != (uint8  [4])0x20534444) {
    return false;
  }
  iVar3 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,&desc,0x7c);
  if (iVar3 != 0x7c) {
    return false;
  }
  if (desc.dwSize != 0x7c) {
    return false;
  }
  if (desc.dwWidth - 0x2001 < 0xffffe000 || desc.dwHeight - 0x2001 < 0xffffe000) {
    return false;
  }
  local_178 = 4;
  this->m_width = desc.dwWidth;
  this->m_height = desc.dwHeight;
  new_size = 1;
  uVar16 = 1;
  if ((((desc.dwFlags & 0x20000) != 0) &&
      (uVar16 = 1, (desc.dwMipMapCount != 0 & desc.ddsCaps.dwCaps._2_1_ >> 6) == 1)) &&
     (uVar4 = utils::compute_max_mips(desc.dwWidth,desc.dwHeight), uVar16 = desc.dwMipMapCount,
     uVar4 < desc.dwMipMapCount)) {
    return false;
  }
  if (((byte)desc.ddsCaps.dwCaps & 8) != 0) {
    if ((desc.ddsCaps.dwCaps2 >> 9 & 1) == 0) {
      if ((desc.ddsCaps.dwCaps2 >> 0x15 & 1) != 0) {
        pcVar18 = "Volume textures unsupported";
        goto LAB_00122e1f;
      }
    }
    else {
      if ((~desc.ddsCaps.dwCaps2 & 0xfc00) != 0) {
        pcVar18 = "Incomplete cubemaps unsupported";
        goto LAB_00122e1f;
      }
      new_size = 6;
    }
  }
  if ((desc.ddpfPixelFormat.dwFlags & 0x20) != 0) {
    pcVar18 = "Palettized textures unsupported";
    goto LAB_00122e1f;
  }
  uVar7 = 0xffffffff;
  if ((desc.ddpfPixelFormat.dwFlags & 4) == 0) {
    if (0x18 < desc.ddpfPixelFormat.dwRGBBitCount - 8 ||
        (desc.ddpfPixelFormat.dwRGBBitCount & 7) != 0) {
      pcVar18 = "Unsupported bit count";
      goto LAB_00122e1f;
    }
    local_178 = uVar7;
    if ((desc.ddpfPixelFormat.dwFlags & 0x40) == 0) {
      if ((desc.ddpfPixelFormat.dwFlags & 1) == 0) {
        if ((desc.ddpfPixelFormat.dwFlags >> 0x11 & 1) != 0) goto LAB_00122c60;
        if ((desc.ddpfPixelFormat.dwFlags & 2) == 0) {
          pcVar18 = "Unsupported format";
          goto LAB_00122e1f;
        }
      }
      else if ((desc.ddpfPixelFormat.dwFlags >> 0x11 & 1) != 0) {
LAB_00122c72:
        this->m_format = PIXEL_FMT_A8L8;
        pVar20 = PIXEL_FMT_A8L8;
        goto LAB_00122d80;
      }
      this->m_format = PIXEL_FMT_A8;
      pVar20 = PIXEL_FMT_A8;
    }
    else if ((desc.ddpfPixelFormat.dwFlags >> 0x11 & 1) == 0) {
      if ((desc.ddpfPixelFormat.dwFlags & 1) == 0) {
        this->m_format = PIXEL_FMT_R8G8B8;
        pVar20 = PIXEL_FMT_R8G8B8;
      }
      else {
        this->m_format = PIXEL_FMT_A8R8G8B8;
        pVar20 = PIXEL_FMT_A8R8G8B8;
      }
    }
    else {
      if ((desc.ddpfPixelFormat.dwFlags & 1) != 0) goto LAB_00122c72;
LAB_00122c60:
      this->m_format = PIXEL_FMT_L8;
      pVar20 = PIXEL_FMT_L8;
    }
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x31435445) {
    this->m_format = PIXEL_FMT_ETC1;
    local_178 = 7;
    pVar20 = PIXEL_FMT_ETC1;
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x31495441) {
    this->m_format = PIXEL_FMT_DXT5A;
    pVar20 = PIXEL_FMT_DXT5A;
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x53413245) {
    this->m_format = PIXEL_FMT_ETC2AS;
    local_178 = 0xb;
    pVar20 = PIXEL_FMT_ETC2AS;
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x32435445) {
    this->m_format = PIXEL_FMT_ETC2;
    local_178 = 8;
    pVar20 = PIXEL_FMT_ETC2;
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x32495441) {
    if (desc.ddpfPixelFormat.dwRGBBitCount == 0x59583241) {
      this->m_format = PIXEL_FMT_DXN;
      local_178 = 5;
      pVar20 = PIXEL_FMT_DXN;
    }
    else {
      this->m_format = PIXEL_FMT_3DC;
      pVar20 = PIXEL_FMT_3DC;
      local_178 = 6;
    }
  }
  else if ((desc.ddpfPixelFormat.dwFourCC == 0x32545844) ||
          (desc.ddpfPixelFormat.dwFourCC == 0x33545844)) {
    this->m_format = PIXEL_FMT_DXT3;
    local_178 = 2;
    pVar20 = PIXEL_FMT_DXT3;
  }
  else if ((desc.ddpfPixelFormat.dwFourCC == 0x34545844) ||
          (desc.ddpfPixelFormat.dwFourCC == 0x35545844)) {
    local_178 = 3;
    if (desc.ddpfPixelFormat.dwRGBBitCount == 0x52424741) {
      this->m_format = PIXEL_FMT_DXT5_AGBR;
      pVar20 = PIXEL_FMT_DXT5_AGBR;
    }
    else if (desc.ddpfPixelFormat.dwRGBBitCount == 0x52424778) {
      this->m_format = PIXEL_FMT_DXT5_xGBR;
      pVar20 = PIXEL_FMT_DXT5_xGBR;
    }
    else if (desc.ddpfPixelFormat.dwRGBBitCount == 0x52784778) {
      this->m_format = PIXEL_FMT_DXT5_xGxR;
      pVar20 = PIXEL_FMT_DXT5_xGxR;
    }
    else if (desc.ddpfPixelFormat.dwRGBBitCount == 0x59784343) {
      this->m_format = PIXEL_FMT_DXT5_CCxY;
      pVar20 = PIXEL_FMT_DXT5_CCxY;
    }
    else {
      this->m_format = PIXEL_FMT_DXT5;
      pVar20 = PIXEL_FMT_DXT5;
    }
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x41325445) {
    this->m_format = PIXEL_FMT_ETC2A;
    local_178 = 9;
    pVar20 = PIXEL_FMT_ETC2A;
  }
  else if (desc.ddpfPixelFormat.dwFourCC == 0x53315445) {
    this->m_format = PIXEL_FMT_ETC1S;
    pVar20 = PIXEL_FMT_ETC1S;
    local_178 = 10;
  }
  else {
    if (desc.ddpfPixelFormat.dwFourCC != 0x31545844) {
      dynamic_string::dynamic_string
                ((dynamic_string *)&load_buf,cVarArg,"Unsupported DDS FOURCC format: 0x%08X");
      pcVar18 = "";
      if (load_buf._8_8_ != 0) {
        pcVar18 = (char *)load_buf._8_8_;
      }
      dynamic_string::operator=(this_00,pcVar18);
      dynamic_string::~dynamic_string((dynamic_string *)&load_buf);
      return false;
    }
    this->m_format = PIXEL_FMT_DXT1;
    local_178 = 0;
    pVar20 = PIXEL_FMT_DXT1;
  }
LAB_00122d80:
  local_154 = uVar16;
  cVar5 = pixel_format_helpers::get_component_flags(pVar20);
  this->m_comp_flags = cVar5;
  uVar4 = desc.ddpfPixelFormat.dwRGBBitCount;
  if ((desc.ddpfPixelFormat.dwFlags & 4) != 0) {
    uVar4 = pixel_format_helpers::get_bpp(this->m_format);
  }
  dynamic_string::operator=(this_00,"Load failed");
  cVar6 = desc.dwWidth;
  if ((desc.ddpfPixelFormat.dwFlags & 4) != 0) {
    cVar6 = (desc.dwWidth + 3 & 0xfffffffc) * (desc.dwHeight + 3 & 0x3ffffffc);
  }
  if (desc.field_4.lPitch == 0 || (desc.dwFlags & 0x80008) != 8) {
    aVar17.dwLinearSize = cVar6 * uVar4 >> 3;
  }
  else {
    aVar17 = desc.field_4;
    if ((cVar6 * uVar4 & 0xfffffff8) < desc.field_4.dwLinearSize) {
      pcVar18 = "Invalid pitch";
LAB_00122e1f:
      dynamic_string::operator=(this_00,pcVar18);
      return false;
    }
  }
  load_buf.m_p = (uchar *)0x0;
  load_buf.m_size = 0;
  load_buf.m_capacity = 0;
  uVar4 = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
  mask_size[0] = uVar4;
  mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
  mask_size[2] = math::bitmask_size(desc.ddpfPixelFormat.dwBBitMask);
  mask_size[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBAlphaBitMask);
  mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
  mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
  mask_ofs[2] = math::bitmask_ofs(desc.ddpfPixelFormat.dwBBitMask);
  mask_ofs[3] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBAlphaBitMask);
  if ((uVar4 == 0 && (desc.ddpfPixelFormat.dwFlags >> 0x11 & 1) != 0) &&
     (mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 3,
     (desc.ddpfPixelFormat.dwFlags & 1) != 0)) {
    mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 4;
  }
  this_01 = &this->m_faces;
  local_150 = aVar17;
  vector<crnlib::vector<crnlib::mip_level_*>_>::resize(this_01,new_size,false);
  uVar8 = (ulong)local_154;
  uVar10 = 0;
  bVar2 = false;
  do {
    if (uVar10 == new_size) {
      dynamic_string::clear(this_00);
      bVar27 = true;
      if (bVar2 != false) {
        change_dxt1_to_dxt1a(this);
      }
LAB_001232d1:
      vector<unsigned_char>::~vector(&load_buf);
      return bVar27;
    }
    vector<crnlib::mip_level_*>::resize(this_01->m_p + uVar10,local_154,false);
    for (uVar26 = 0; uVar26 != uVar8; uVar26 = uVar26 + 1) {
      uVar16 = desc.dwWidth >> ((byte)uVar26 & 0x1f);
      width = uVar16 + (uVar16 == 0);
      uVar16 = desc.dwHeight >> ((byte)uVar26 & 0x1f);
      height = uVar16 + (uVar16 == 0);
      this_02 = crnlib_new<crnlib::mip_level>();
      this_01->m_p[uVar10].m_p[uVar26] = this_02;
      if ((desc.ddpfPixelFormat.dwFlags & 4) == 0) {
        local_168 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                              ((crnlib *)&width,&height,&this_02->m_width);
        local_168->m_comp_flags = this->m_comp_flags;
        uVar16 = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
        local_14c.lPitch = width * uVar16;
        if (uVar26 == 0) {
          local_14c = local_150;
        }
        if (load_buf.m_size < local_14c.dwLinearSize) {
          vector<unsigned_char>::resize(&load_buf,local_14c.dwLinearSize,false);
        }
        local_174[0] = '\0';
        local_174[1] = '\0';
        local_174[2] = '\0';
        local_174[3] = 0xff;
        uVar7 = 0;
        while (aVar17 = local_14c, uVar7 < height) {
          local_160 = (dxt_image *)CONCAT44(local_160._4_4_,uVar7);
          p = (image<crnlib::color_quad<unsigned_char,_int>_> *)load_buf.m_p;
          uVar7 = (*serializer->m_pStream->_vptr_data_stream[4])();
          if (uVar7 != aVar17.lPitch) {
            crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                      ((crnlib *)local_168,p);
            goto LAB_001232c3;
          }
          iVar3 = (int)local_160;
          pcVar19 = local_168->m_pPixels + local_168->m_pitch * (int)local_160;
          uVar7 = 0;
          for (uVar21 = 0; uVar21 < width; uVar21 = uVar21 + 1) {
            pbVar9 = load_buf.m_p + uVar7;
            uVar22 = 0;
            for (uVar13 = 0; uVar16 * 8 != uVar13; uVar13 = uVar13 + 8) {
              uVar22 = uVar22 | (uint)*pbVar9 << ((byte)uVar13 & 0x1f);
              pbVar9 = pbVar9 + 1;
            }
            for (lVar23 = 0; auVar1 = local_174, lVar23 != 4; lVar23 = lVar23 + 1) {
              if (mask_size[lVar23] != 0) {
                uVar24 = ~(-1 << ((byte)mask_size[lVar23] & 0x1f));
                uVar13 = (ulong)((uVar24 >> 1) +
                                (uVar22 >> ((byte)mask_ofs[lVar23] & 0x1f) & uVar24) * 0xff) /
                         (ulong)uVar24;
                uVar24 = (uint)uVar13;
                uVar14 = 0xff;
                if (uVar24 < 0xff) {
                  uVar14 = uVar13;
                }
                uVar11 = (uchar)uVar14;
                if ((int)uVar24 < 0) {
                  uVar11 = '\0';
                }
                local_174[lVar23] = uVar11;
              }
            }
            uVar11 = local_174[0];
            if ((desc.ddpfPixelFormat.dwFlags & 0x20000) == 0) {
              uVar15 = local_174[1];
              uVar12 = local_174[2];
            }
            else {
              local_174[1] = local_174[0];
              local_174[3] = auVar1[3];
              local_174[2] = local_174[0];
              uVar15 = local_174[0];
              uVar12 = local_174[0];
            }
            (pcVar19->field_0).field_0.r = uVar11;
            (pcVar19->field_0).field_0.g = uVar15;
            (pcVar19->field_0).field_0.b = uVar12;
            (pcVar19->field_0).field_0.a = local_174[3];
            pcVar19 = pcVar19 + 1;
            uVar7 = uVar7 + uVar16;
          }
          uVar7 = iVar3 + 1;
        }
        mip_level::assign(this_02,local_168,this->m_format,cDefaultOrientationFlags);
      }
      else {
        uVar4 = pixel_format_helpers::get_dxt_bytes_per_block(this->m_format);
        aVar25.lPitch = (width + 3 >> 2) * uVar4 * (height + 3 >> 2);
        aVar17.lPitch = aVar25.lPitch;
        if (uVar26 == 0) {
          aVar17 = local_150;
        }
        local_168 = (image<crnlib::color_quad<unsigned_char,_int>_> *)(ulong)aVar17.dwLinearSize;
        local_160 = crnlib_new<crnlib::dxt_image>();
        iVar3 = dxt_image::init(local_160,(EVP_PKEY_CTX *)(ulong)local_178);
        if ((((char)iVar3 == '\0') ||
            (uVar16 = (*serializer->m_pStream->_vptr_data_stream[4])
                                (serializer->m_pStream,(local_160->m_elements).m_p,
                                 (ulong)aVar25.dwLinearSize), uVar16 != aVar25.lPitch)) ||
           ((uVar7 = (uint)local_168, uVar16 = uVar7 - (int)aVar25,
            local_168 = (image<crnlib::color_quad<unsigned_char,_int>_> *)(ulong)uVar16,
            aVar25.dwLinearSize <= uVar7 && uVar16 != 0 &&
            (iVar3 = (*serializer->m_pStream->_vptr_data_stream[5])(serializer->m_pStream,local_168)
            , (image_u8 *)CONCAT44(extraout_var,iVar3) != local_168)))) {
          crnlib_delete<crnlib::dxt_image>(local_160);
LAB_001232c3:
          bVar27 = new_size <= uVar10;
          goto LAB_001232d1;
        }
        pVar20 = this->m_format;
        if ((pVar20 == PIXEL_FMT_DXT1) && (pVar20 = PIXEL_FMT_DXT1, bVar2 == false)) {
          bVar2 = dxt_image::has_alpha(local_160);
          pVar20 = this->m_format;
        }
        mip_level::assign(this_02,local_160,pVar20,cDefaultOrientationFlags);
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool mipmapped_texture::read_dds_internal(data_stream_serializer& serializer) {
  CRNLIB_ASSERT(serializer.get_little_endian());

  clear();

  set_last_error("Not a DDS file");

  uint8 hdr[4];
  if (!serializer.read(hdr, sizeof(hdr)))
    return false;

  if (memcmp(hdr, "DDS ", 4) != 0)
    return false;

  DDSURFACEDESC2 desc;
  if (!serializer.read(&desc, sizeof(desc)))
    return false;

  if (!c_crnlib_little_endian_platform)
    utils::endian_switch_dwords(reinterpret_cast<uint32*>(&desc), sizeof(desc) / sizeof(uint32));

  if (desc.dwSize != sizeof(desc))
    return false;

  if ((!desc.dwHeight) || (!desc.dwWidth) || (desc.dwHeight > cDDSMaxImageDimensions) || (desc.dwWidth > cDDSMaxImageDimensions))
    return false;

  m_width = desc.dwWidth;
  m_height = desc.dwHeight;

  uint num_mip_levels = 1;

  if ((desc.dwFlags & DDSD_MIPMAPCOUNT) && (desc.ddsCaps.dwCaps & DDSCAPS_MIPMAP) && (desc.dwMipMapCount)) {
    num_mip_levels = desc.dwMipMapCount;
    if (num_mip_levels > utils::compute_max_mips(desc.dwWidth, desc.dwHeight))
      return false;
  }

  uint num_faces = 1;

  if (desc.ddsCaps.dwCaps & DDSCAPS_COMPLEX) {
    if (desc.ddsCaps.dwCaps2 & DDSCAPS2_CUBEMAP) {
      const uint all_faces_mask = DDSCAPS2_CUBEMAP_POSITIVEX | DDSCAPS2_CUBEMAP_NEGATIVEX | DDSCAPS2_CUBEMAP_POSITIVEY | DDSCAPS2_CUBEMAP_NEGATIVEY | DDSCAPS2_CUBEMAP_POSITIVEZ | DDSCAPS2_CUBEMAP_NEGATIVEZ;
      if ((desc.ddsCaps.dwCaps2 & all_faces_mask) != all_faces_mask) {
        set_last_error("Incomplete cubemaps unsupported");
        return false;
      }

      num_faces = 6;
    } else if (desc.ddsCaps.dwCaps2 & DDSCAPS2_VOLUME) {
      set_last_error("Volume textures unsupported");
      return false;
    }
  }

  if (desc.ddpfPixelFormat.dwFlags & DDPF_PALETTEINDEXED8) {
    // It's difficult to even make P8 textures with existing tools:
    // nvdxt just hangs
    // dxtex.exe just makes all-white textures
    // So screw it.
    set_last_error("Palettized textures unsupported");
    return false;
  }

  dxt_format dxt_fmt = cDXTInvalid;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
    // http://code.google.com/p/nvidia-texture-tools/issues/detail?id=41
    // ATI2 YX:            0 (0x00000000)
    // ATI2 XY:   1498952257 (0x59583241) (BC5)
    // ATI Compressonator obeys this stuff, nvidia's tools (like readdxt) don't - oh great

    switch (desc.ddpfPixelFormat.dwFourCC) {
      case PIXEL_FMT_DXT1: {
        m_format = PIXEL_FMT_DXT1;
        dxt_fmt = cDXT1;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        m_format = PIXEL_FMT_DXT3;
        dxt_fmt = cDXT3;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5: {
        switch (desc.ddpfPixelFormat.dwRGBBitCount) {
          case PIXEL_FMT_DXT5_CCxY:
            m_format = PIXEL_FMT_DXT5_CCxY;
            break;
          case PIXEL_FMT_DXT5_xGxR:
            m_format = PIXEL_FMT_DXT5_xGxR;
            break;
          case PIXEL_FMT_DXT5_xGBR:
            m_format = PIXEL_FMT_DXT5_xGBR;
            break;
          case PIXEL_FMT_DXT5_AGBR:
            m_format = PIXEL_FMT_DXT5_AGBR;
            break;
          default:
            m_format = PIXEL_FMT_DXT5;
            break;
        }

        dxt_fmt = cDXT5;
        break;
      }
      case PIXEL_FMT_3DC: {
        if (desc.ddpfPixelFormat.dwRGBBitCount == CRNLIB_PIXEL_FMT_FOURCC('A', '2', 'X', 'Y')) {
          dxt_fmt = cDXN_XY;
          m_format = PIXEL_FMT_DXN;
        } else {
          dxt_fmt = cDXN_YX;  // aka ATI2
          m_format = PIXEL_FMT_3DC;
        }

        break;
      }
      case PIXEL_FMT_DXT5A: {
        m_format = PIXEL_FMT_DXT5A;
        dxt_fmt = cDXT5A;
        break;
      }
      case PIXEL_FMT_ETC1: {
        m_format = PIXEL_FMT_ETC1;
        dxt_fmt = cETC1;
        break;
      }
      case PIXEL_FMT_ETC2: {
        m_format = PIXEL_FMT_ETC2;
        dxt_fmt = cETC2;
        break;
      }
      case PIXEL_FMT_ETC2A: {
        m_format = PIXEL_FMT_ETC2A;
        dxt_fmt = cETC2A;
        break;
      }
      case PIXEL_FMT_ETC1S: {
        m_format = PIXEL_FMT_ETC1S;
        dxt_fmt = cETC1S;
        break;
      }
      case PIXEL_FMT_ETC2AS: {
        m_format = PIXEL_FMT_ETC2AS;
        dxt_fmt = cETC2AS;
        break;
      }
      default: {
        dynamic_string err_msg(cVarArg, "Unsupported DDS FOURCC format: 0x%08X", desc.ddpfPixelFormat.dwFourCC);
        set_last_error(err_msg.get_ptr());
        return false;
      }
    }
  } else if ((desc.ddpfPixelFormat.dwRGBBitCount < 8) || (desc.ddpfPixelFormat.dwRGBBitCount > 32) || (desc.ddpfPixelFormat.dwRGBBitCount & 7)) {
    set_last_error("Unsupported bit count");
    return false;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_RGB) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
      if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
        m_format = PIXEL_FMT_A8L8;
      else
        m_format = PIXEL_FMT_L8;
    } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      m_format = PIXEL_FMT_A8R8G8B8;
    else
      m_format = PIXEL_FMT_R8G8B8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE)
      m_format = PIXEL_FMT_A8L8;
    else
      m_format = PIXEL_FMT_A8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
    m_format = PIXEL_FMT_L8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHA) {
    m_format = PIXEL_FMT_A8;
  } else {
    set_last_error("Unsupported format");
    return false;
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  uint bits_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    bits_per_pixel = pixel_format_helpers::get_bpp(m_format);

  set_last_error("Load failed");

  uint default_pitch;
  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    default_pitch = (((desc.dwWidth + 3) & ~3) * ((desc.dwHeight + 3) & ~3) * bits_per_pixel) >> 3;
  else
    default_pitch = (desc.dwWidth * bits_per_pixel) >> 3;

  uint pitch = 0;
  if ((desc.dwFlags & DDSD_PITCH) && (!(desc.dwFlags & DDSD_LINEARSIZE))) {
    pitch = desc.lPitch;
  }

  if (!pitch)
    pitch = default_pitch;
#if 0
      else if (pitch & 3)
      {
         // MS's DDS docs say the pitch must be DWORD aligned - but this isn't always the case.
         // ATI Compressonator writes images with non-DWORD aligned pitches, and the DDSWithoutD3DX sample from MS doesn't compute the proper DWORD aligned pitch when reading DDS
         // files, so the docs must be wrong/outdated.
         console::warning("DDS file's pitch is not divisible by 4 - trying to load anyway.");
      }
#endif
  // Check for obviously wacky source pitches (probably a corrupted/invalid file).
  else if (pitch > default_pitch * 8) {
    set_last_error("Invalid pitch");
    return false;
  }

  crnlib::vector<uint8> load_buf;

  uint mask_size[4];
  mask_size[0] = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
  mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
  mask_size[2] = math::bitmask_size(desc.ddpfPixelFormat.dwBBitMask);
  mask_size[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  uint mask_ofs[4];
  mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
  mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
  mask_ofs[2] = math::bitmask_ofs(desc.ddpfPixelFormat.dwBBitMask);
  mask_ofs[3] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  if ((desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) && (!mask_size[0])) {
    mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
    if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      mask_size[0] /= 2;
  }

  m_faces.resize(num_faces);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(desc.dwWidth >> level_index, 1U);
      const uint height = math::maximum<uint>(desc.dwHeight >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint actual_level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        const uint level_pitch = level_index ? actual_level_pitch : pitch;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == actual_level_pitch);

        if (!serializer.read(&pDXTImage->get_element_vec()[0], actual_level_pitch)) {
          crnlib_delete(pDXTImage);

          return false;
        }

        // DDS image in memory are always assumed to be little endian - the same as DDS itself.
        //if (c_crnlib_big_endian_platform)
        //   utils::endian_switch_words(reinterpret_cast<uint16*>(&pDXTImage->get_element_vec()[0]), actual_level_pitch / sizeof(uint16));

        if (level_pitch > actual_level_pitch) {
          if (!serializer.skip(level_pitch - actual_level_pitch)) {
            crnlib_delete(pDXTImage);

            return false;
          }
        }

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format);
      } else {
        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint bytes_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
        const uint actual_line_pitch = width * bytes_per_pixel;
        const uint line_pitch = level_index ? actual_line_pitch : pitch;

        if (load_buf.size() < line_pitch)
          load_buf.resize(line_pitch);

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          if (!serializer.read(&load_buf[0], line_pitch)) {
            crnlib_delete(pImage);
            return false;
          }

          color_quad_u8* pDst = pImage->get_scanline(y);

          for (uint x = 0; x < width; x++) {
            const uint8* pPixel = &load_buf[x * bytes_per_pixel];

            uint c = 0;
            // Assumes DDS is always little endian.
            for (uint l = 0; l < bytes_per_pixel; l++)
              c |= (pPixel[l] << (l * 8U));

            for (uint i = 0; i < 4; i++) {
              if (!mask_size[i])
                continue;

              uint mask = (1U << mask_size[i]) - 1U;
              uint bits = (c >> mask_ofs[i]) & mask;

              uint v = (bits * 255 + (mask >> 1)) / mask;

              q.set_component(i, v);
            }

            if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
              q.g = q.r;
              q.b = q.r;
            }

            *pDst++ = q;
          }
        }

        pMip->assign(pImage, m_format);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}